

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O0

uint Imf_2_5::halfToUint(half h)

{
  bool bVar1;
  float fVar2;
  half local_6;
  uint local_4;
  
  bVar1 = ::half::isNegative(&local_6);
  if ((!bVar1) && (bVar1 = ::half::isNan(&local_6), !bVar1)) {
    bVar1 = ::half::isInfinity(&local_6);
    if (!bVar1) {
      fVar2 = ::half::operator_cast_to_float(&local_6);
      local_4 = (uint)(long)fVar2;
      return local_4;
    }
    return 0xffffffff;
  }
  return 0;
}

Assistant:

unsigned int
halfToUint (half h)
{
    if (h.isNegative() || h.isNan())
	return 0;

    if (h.isInfinity())
	return UINT_MAX;

    return (unsigned int) h;
}